

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::IsContinuationOfLowWorkHeadersSync
          (PeerManagerImpl *this,Peer *peer,CNode *pfrom,
          vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  bool bVar2;
  common_comparison_category_t<__detail::__synth3way_t<arith_uint256>,___detail::__synth3way_t<optional<pair<long,_unsigned_int>_>_>_>
  cVar3;
  State SVar4;
  type *ptVar5;
  type *ptVar6;
  pointer ppVar7;
  NodeId NVar8;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  type *stat;
  type *peer_1;
  map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
  *__range4;
  HeadersPresyncStats *stat_best;
  NodeId peer_best;
  bool best_updated;
  iterator __end4;
  iterator __begin4;
  iterator best_it;
  bool sent_getheaders;
  CBlockLocator locator;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock63;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock62;
  ProcessingResult result;
  HeadersPresyncStats stats;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  char *in_stack_fffffffffffffd80;
  pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined1 fTry;
  int in_stack_fffffffffffffd9c;
  undefined6 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda6;
  undefined1 in_stack_fffffffffffffda7;
  char *in_stack_fffffffffffffda8;
  long lVar9;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  CBlockLocator *in_stack_fffffffffffffdc0;
  CNode *in_stack_fffffffffffffdc8;
  PeerManagerImpl *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  LogFlags in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffdf7;
  vector<CBlockHeader,_std::allocator<CBlockHeader>_> *in_stack_fffffffffffffdf8;
  HeadersSyncState *in_stack_fffffffffffffe00;
  ConstevalFormatString<2U> in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  type *ptVar10;
  type local_1b0;
  bool local_163;
  Level in_stack_ffffffffffffff20;
  undefined8 local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  long *in_stack_ffffffffffffff38;
  byte local_88;
  byte local_87;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (!bVar1) {
    local_163 = false;
    goto LAB_010997de;
  }
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::size
            ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  HeadersSyncState::ProcessNextHeaders
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
  if ((local_88 & 1) != 0) {
    std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::
    time_point((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    *(undefined8 *)(in_RSI + 0x200) = local_d8;
  }
  if ((local_87 & 1) != 0) {
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    HeadersSyncState::NextHeadersRequestLocator
              ((HeadersSyncState *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    std::vector<uint256,_std::allocator<uint256>_>::empty
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffd88);
    inline_assertion_check<false,bool>
              ((bool *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
               in_stack_fffffffffffffd80,
               (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    inline_assertion_check<false,bool&>
              ((bool *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
               in_stack_fffffffffffffd80,
               (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    bVar1 = std::vector<uint256,_std::allocator<uint256>_>::empty
                      ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffd88);
    if (!bVar1) {
      MaybeSendGetHeaders(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                          in_stack_fffffffffffffdc0,
                          (Peer *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      inline_assertion_check<false,bool&>
                ((bool *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                 in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                 in_stack_fffffffffffffd80,
                 (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                                  Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffd90);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffd90);
        std::vector<uint256,_std::allocator<uint256>_>::front
                  ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffd80);
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffd80);
        CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        in_stack_fffffffffffffd88 =
             (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
             &stack0xffffffffffffffd8;
        in_stack_fffffffffffffd80 = "more getheaders (from %s) to peer=%d\n";
        in_stack_fffffffffffffd78 = 1;
        logging_function._M_str = in_stack_fffffffffffffe48;
        logging_function._M_len = in_stack_fffffffffffffe40;
        source_file._M_str = in_stack_fffffffffffffe38;
        source_file._M_len = in_stack_fffffffffffffe30;
        LogPrintFormatInternal<std::__cxx11::string,long>
                  (logging_function,source_file,in_stack_fffffffffffffdec,in_stack_fffffffffffffde0,
                   in_stack_ffffffffffffff20,in_stack_fffffffffffffe28,in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff38);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      }
    }
    CBlockLocator::~CBlockLocator
              ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  }
  std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
            ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  SVar4 = HeadersSyncState::GetState
                    ((HeadersSyncState *)
                     CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  if (SVar4 == FINAL) {
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::reset
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),(pointer)0x1099217);
    fTry = (undefined1)((uint)in_stack_fffffffffffffd98 >> 0x18);
    MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)CONCAT17(in_stack_fffffffffffffda7,
                                CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)),
               in_stack_fffffffffffffd9c,(bool)fTry);
    CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    std::
    map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
    ::erase((map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
             *)in_stack_fffffffffffffd88,(key_type_conflict4 *)in_stack_fffffffffffffd80);
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  }
  else {
    std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>::
    pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>,_true>
              ((pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    HeadersSyncState::GetPresyncWork((HeadersSyncState *)in_stack_fffffffffffffd80);
    arith_uint256::operator=
              (&in_stack_fffffffffffffd88->first,(arith_uint256 *)in_stack_fffffffffffffd80);
    std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
              ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    SVar4 = HeadersSyncState::GetState
                      ((HeadersSyncState *)
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    if (SVar4 == PRESYNC) {
      std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
                ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      HeadersSyncState::GetPresyncHeight
                ((HeadersSyncState *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      std::unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_>::operator->
                ((unique_ptr<HeadersSyncState,_std::default_delete<HeadersSyncState>_> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      HeadersSyncState::GetPresyncTime
                ((HeadersSyncState *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      std::pair<long,_unsigned_int>::pair<long,_unsigned_int,_true>
                ((pair<long,_unsigned_int> *)in_stack_fffffffffffffd88,
                 (long *)in_stack_fffffffffffffd80,
                 (uint *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      std::optional<std::pair<long,unsigned_int>>::operator=
                ((optional<std::pair<long,_unsigned_int>_> *)in_stack_fffffffffffffd88,
                 (pair<long,_unsigned_int> *)in_stack_fffffffffffffd80);
    }
    MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (char *)CONCAT17(in_stack_fffffffffffffda7,
                                CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)),
               in_stack_fffffffffffffd9c,SUB41((uint)in_stack_fffffffffffffd98 >> 0x18,0));
    CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    std::
    map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
    ::operator[]((map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffda7,
                             CONCAT16(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0)),
                 (key_type_conflict4 *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                );
    std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>::operator=
              (in_stack_fffffffffffffd88,(type)in_stack_fffffffffffffd80);
    std::
    map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
    ::find((map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
            *)in_stack_fffffffffffffd80,
           (key_type_conflict4 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    bVar1 = false;
    std::
    map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
    ::end((map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
           *)in_stack_fffffffffffffd80);
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffd88,(_Self *)in_stack_fffffffffffffd80);
    if (bVar2) {
      local_1b0 = -1;
      ptVar10 = (type *)0x0;
      std::
      map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
      ::begin((map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
               *)in_stack_fffffffffffffd80);
      std::
      map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
      ::end((map<long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>_>
             *)in_stack_fffffffffffffd80);
      while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffd88,
                                     (_Self *)in_stack_fffffffffffffd80), ((bVar1 ^ 0xffU) & 1) != 0
            ) {
        std::
        _Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>
        ::operator*((_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        ptVar5 = std::
                 get<0ul,long_const,std::pair<arith_uint256,std::optional<std::pair<long,unsigned_int>>>>
                           ((pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        ptVar6 = std::
                 get<1ul,long_const,std::pair<arith_uint256,std::optional<std::pair<long,unsigned_int>>>>
                           ((pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        if (ptVar10 == (type *)0x0) {
LAB_010995e4:
          local_1b0 = *ptVar5;
          ptVar10 = ptVar6;
        }
        else {
          cVar3 = std::operator<=><arith_uint256,std::optional<std::pair<long,unsigned_int>>>
                            ((pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
                             in_stack_fffffffffffffd80,
                             (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
                             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          std::__cmp_cat::__unspec::__unspec
                    ((__unspec *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     (__unspec *)0x10995d1);
          bVar1 = std::operator>(cVar3._M_value);
          if (bVar1) goto LAB_010995e4;
        }
        std::
        _Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      }
      *(type *)(in_RDI + 0x3f8) = local_1b0;
      NVar8 = CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      bVar1 = local_1b0 == NVar8;
    }
    else {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      lVar9 = ppVar7->first;
      NVar8 = CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      if (lVar9 != NVar8) {
        std::
        _Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_long,_std::pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        cVar3 = std::operator<=><arith_uint256,std::optional<std::pair<long,unsigned_int>>>
                          ((pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
                           in_stack_fffffffffffffd80,
                           (pair<arith_uint256,_std::optional<std::pair<long,_unsigned_int>_>_> *)
                           CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
        std::__cmp_cat::__unspec::__unspec
                  ((__unspec *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (__unspec *)0x1099706);
        bVar2 = std::operator>(cVar3._M_value);
        if (!bVar2) goto LAB_01099742;
      }
      NVar8 = CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      *(NodeId *)(in_RDI + 0x3f8) = NVar8;
      bVar1 = true;
    }
LAB_01099742:
    if ((bVar1) &&
       (bVar1 = std::optional<std::pair<long,_unsigned_int>_>::has_value
                          ((optional<std::pair<long,_unsigned_int>_> *)
                           CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)), bVar1)) {
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),false
                );
    }
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  }
  if ((local_88 & 1) != 0) {
    std::vector<CBlockHeader,_std::allocator<CBlockHeader>_>::swap
              ((vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffffd88,
               (vector<CBlockHeader,_std::allocator<CBlockHeader>_> *)in_stack_fffffffffffffd80);
  }
  local_163 = (bool)(local_88 & 1);
  HeadersSyncState::ProcessingResult::~ProcessingResult
            ((ProcessingResult *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
LAB_010997de:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_163;
}

Assistant:

bool PeerManagerImpl::IsContinuationOfLowWorkHeadersSync(Peer& peer, CNode& pfrom, std::vector<CBlockHeader>& headers)
{
    if (peer.m_headers_sync) {
        auto result = peer.m_headers_sync->ProcessNextHeaders(headers, headers.size() == m_opts.max_headers_result);
        // If it is a valid continuation, we should treat the existing getheaders request as responded to.
        if (result.success) peer.m_last_getheaders_timestamp = {};
        if (result.request_more) {
            auto locator = peer.m_headers_sync->NextHeadersRequestLocator();
            // If we were instructed to ask for a locator, it should not be empty.
            Assume(!locator.vHave.empty());
            // We can only be instructed to request more if processing was successful.
            Assume(result.success);
            if (!locator.vHave.empty()) {
                // It should be impossible for the getheaders request to fail,
                // because we just cleared the last getheaders timestamp.
                bool sent_getheaders = MaybeSendGetHeaders(pfrom, locator, peer);
                Assume(sent_getheaders);
                LogDebug(BCLog::NET, "more getheaders (from %s) to peer=%d\n",
                    locator.vHave.front().ToString(), pfrom.GetId());
            }
        }

        if (peer.m_headers_sync->GetState() == HeadersSyncState::State::FINAL) {
            peer.m_headers_sync.reset(nullptr);

            // Delete this peer's entry in m_headers_presync_stats.
            // If this is m_headers_presync_bestpeer, it will be replaced later
            // by the next peer that triggers the else{} branch below.
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats.erase(pfrom.GetId());
        } else {
            // Build statistics for this peer's sync.
            HeadersPresyncStats stats;
            stats.first = peer.m_headers_sync->GetPresyncWork();
            if (peer.m_headers_sync->GetState() == HeadersSyncState::State::PRESYNC) {
                stats.second = {peer.m_headers_sync->GetPresyncHeight(),
                                peer.m_headers_sync->GetPresyncTime()};
            }

            // Update statistics in stats.
            LOCK(m_headers_presync_mutex);
            m_headers_presync_stats[pfrom.GetId()] = stats;
            auto best_it = m_headers_presync_stats.find(m_headers_presync_bestpeer);
            bool best_updated = false;
            if (best_it == m_headers_presync_stats.end()) {
                // If the cached best peer is outdated, iterate over all remaining ones (including
                // newly updated one) to find the best one.
                NodeId peer_best{-1};
                const HeadersPresyncStats* stat_best{nullptr};
                for (const auto& [peer, stat] : m_headers_presync_stats) {
                    if (!stat_best || stat > *stat_best) {
                        peer_best = peer;
                        stat_best = &stat;
                    }
                }
                m_headers_presync_bestpeer = peer_best;
                best_updated = (peer_best == pfrom.GetId());
            } else if (best_it->first == pfrom.GetId() || stats > best_it->second) {
                // pfrom was and remains the best peer, or pfrom just became best.
                m_headers_presync_bestpeer = pfrom.GetId();
                best_updated = true;
            }
            if (best_updated && stats.second.has_value()) {
                // If the best peer updated, and it is in its first phase, signal.
                m_headers_presync_should_signal = true;
            }
        }

        if (result.success) {
            // We only overwrite the headers passed in if processing was
            // successful.
            headers.swap(result.pow_validated_headers);
        }

        return result.success;
    }
    // Either we didn't have a sync in progress, or something went wrong
    // processing these headers, or we are returning headers to the caller to
    // process.
    return false;
}